

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::drawBackground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (*(long *)(lVar1 + 0x498) != 0)) && (*(int *)(*(long *)(lVar1 + 0x4e0) + 4) == 0)) {
    (**(code **)(**(long **)(lVar1 + 0x498) + 0xe8))(*(long **)(lVar1 + 0x498),painter,rect);
    return;
  }
  uVar2 = QPainter::renderHints();
  if ((uVar2 & 1) == 0) {
    QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
    return;
  }
  QPainter::setRenderHints(painter,1,0);
  QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
  QPainter::setRenderHints(painter,1,1);
  return;
}

Assistant:

void QGraphicsView::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->backgroundBrush.style() == Qt::NoBrush) {
        d->scene->drawBackground(painter, rect);
        return;
    }

    const bool wasAa = painter->testRenderHint(QPainter::Antialiasing);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, false);
    painter->fillRect(rect, d->backgroundBrush);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, true);
}